

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

const_iterator * __thiscall
Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
          (const_iterator *__return_storage_ptr__,Matrix_Sparse_Row<Disa::Matrix_Sparse> *this)

{
  matrix_type *sparse_matrix;
  reference pvVar1;
  reference i_column;
  reference value;
  size_t *offset;
  Matrix_Sparse_Row<Disa::Matrix_Sparse> *this_local;
  
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->matrix->row_non_zero,this->row_index + 1);
  sparse_matrix = this->matrix;
  i_column = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->matrix->column_index,*pvVar1);
  value = std::vector<double,_std::allocator<double>_>::operator[]
                    (&this->matrix->element_value,*pvVar1);
  Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
            (__return_storage_ptr__,sparse_matrix,&this->row_index,i_column,value);
  return __return_storage_ptr__;
}

Assistant:

typename Matrix_Sparse_Row<_matrix_type>::const_iterator Matrix_Sparse_Row<_matrix_type>::end() const {
  const std::size_t& offset = matrix->row_non_zero[row_index + 1];
  return {matrix, row_index, &matrix->column_index[offset], &matrix->element_value[offset]};
}